

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

pair<double_*,_bool>
HighsHashTree<std::pair<int,_int>,_double>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,
          HighsHashTableEntry<std::pair<int,_int>,_double> *entry)

{
  int *piVar1;
  byte bVar2;
  double dVar3;
  uint uVar4;
  InnerLeaf<1> *this;
  ValueType *pVVar6;
  int iVar5;
  ulong *puVar7;
  undefined8 *puVar8;
  sbyte sVar9;
  long lVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar11;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  int i;
  undefined8 *puVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  Entry *pEVar16;
  double *pdVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *paVar22;
  double *pdVar23;
  InnerLeaf<4> *this_00;
  BranchNode *branch;
  ulong uVar24;
  undefined1 auVar25 [16];
  pair<double_*,_bool> pVar26;
  pair<double_*,_bool> pVar27;
  pair<double_*,_bool> pVar28;
  array<unsigned_char,_55UL> sizes;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [15];
  undefined1 uStack_39;
  undefined7 uStack_38;
  
  uVar24 = insertNode->ptrAndType;
  switch((uint)uVar24 & 7) {
  case 0:
    if (hashPos != 9) {
      this = (InnerLeaf<1> *)operator_new(0xa8);
      (this->occupation).occupation = 0;
      this->size = 0;
      lVar15 = 0x4c;
      do {
        *(undefined8 *)((long)(this->hashes)._M_elems + lVar15 + -0x14) = 0;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0xac);
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar26 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
      return pVar26;
    }
    puVar8 = (undefined8 *)operator_new(0x20);
    *puVar8 = 0;
    dVar3 = entry->value_;
    *(pair<int,_int> *)(puVar8 + 1) = entry->key_;
    puVar8[2] = dVar3;
    *(undefined4 *)(puVar8 + 3) = 1;
    insertNode->ptrAndType = (ulong)puVar8 | 1;
    uVar11 = extraout_RDX;
    goto LAB_003265bd;
  case 1:
    puVar8 = (undefined8 *)(uVar24 & 0xfffffffffffffff8);
    do {
      puVar12 = puVar8;
      auVar25._0_4_ = -(uint)((int)puVar12[1] == (entry->key_).first);
      iVar21 = -(uint)((int)((ulong)puVar12[1] >> 0x20) == (entry->key_).second);
      auVar25._4_4_ = auVar25._0_4_;
      auVar25._8_4_ = iVar21;
      auVar25._12_4_ = iVar21;
      iVar21 = movmskpd((int)puVar12,auVar25);
      if (iVar21 == 3) {
        uVar11 = 0;
        goto LAB_003266ec;
      }
      puVar8 = (undefined8 *)*puVar12;
    } while ((undefined8 *)*puVar12 != (undefined8 *)0x0);
    puVar8 = (undefined8 *)operator_new(0x18);
    *puVar8 = 0;
    dVar3 = entry->value_;
    *(pair<int,_int> *)(puVar8 + 1) = entry->key_;
    puVar8[2] = dVar3;
    *puVar12 = puVar8;
    piVar1 = (int *)((undefined8 *)(uVar24 & 0xfffffffffffffff8) + 3);
    *piVar1 = *piVar1 + 1;
    uVar11 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar12 = puVar8;
LAB_003266ec:
    pVar27._8_8_ = uVar11;
    pVar27.first = (double *)(puVar12 + 2);
    break;
  case 2:
    pVar27 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar24 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar27 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar24 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar27 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar24 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar24 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar26 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      return pVar26;
    }
    pVVar6 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
    if (pVVar6 != (ValueType *)0x0) {
      pVar26._8_8_ = 0;
      pVar26.first = pVVar6;
      return pVar26;
    }
    uVar4 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar24 = (this_00->occupation).occupation | 1L << (ulong)uVar4;
    lVar15 = POPCOUNT(uVar24);
    puVar7 = (ulong *)operator_new((lVar15 * 8 + 0x7fffffff8U & 0x7fffffff8) + 0x4f &
                                   0xffffffffffffffc0);
    insertNode->ptrAndType = (ulong)puVar7 | 6;
    *puVar7 = uVar24;
    iVar21 = hashPos + 1;
    uVar14 = (uint)lVar15;
    sVar9 = (sbyte)uVar4;
    if (iVar21 != 9) {
      if (uVar14 < 2) {
        insertNode = (NodePtr *)(puVar7 + 1);
        puVar7[1] = (ulong)this_00 | 5;
        InnerLeaf<4>::rehash(this_00,iVar21);
      }
      else {
        uVar4 = this_00->size;
        local_70 = (ulong)uVar4;
        iVar5 = (uVar4 - uVar14) + 2;
        if (iVar5 < 7) {
          lVar13 = 0;
          do {
            puVar8 = (undefined8 *)operator_new(0xa8);
            *puVar8 = 0;
            *(undefined4 *)(puVar8 + 1) = 0;
            lVar10 = 0;
            do {
              *(undefined8 *)((long)puVar8 + lVar10 + 0x48) = 0;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x60);
            puVar8[2] = 0;
            puVar7[lVar13 + 1] = (ulong)puVar8 | 2;
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar15);
          if (0 < (int)local_70) {
            pEVar16 = (this_00->entries)._M_elems;
            lVar15 = 0;
            do {
              uVar18 = (ulong)pEVar16->key_ & 0xffffffff;
              uVar19 = (ulong)pEVar16->key_ >> 0x20;
              InnerLeaf<1>::insert_entry
                        ((InnerLeaf<1> *)
                         (puVar7[POPCOUNT(uVar24 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar15]
                                                           >> 10) & 0x3f))] & 0xfffffffffffffff8),
                         (uVar19 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20 ^
                         (uVar19 + 0x8a183895eeac1536) * (uVar18 + 0x42d8680e260ae5b),iVar21,pEVar16
                        );
              lVar15 = lVar15 + 1;
              pEVar16 = pEVar16 + 1;
            } while (lVar15 < this_00->size);
          }
          operator_delete(this_00);
          pVar28 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)
                              (puVar7[POPCOUNT(uVar24 >> sVar9)] & 0xfffffffffffffff8),hash,iVar21,
                              entry);
          iVar21 = hashPos;
        }
        else {
          local_48 = SUB1615((undefined1  [16])0x0,0);
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          uStack_39 = 0;
          uStack_38 = 0;
          local_68[POPCOUNT(uVar24 >> sVar9) + -1] =
               local_68[POPCOUNT(uVar24 >> sVar9) + -1] + '\x01';
          if (0 < (int)uVar4) {
            uVar18 = 0;
            do {
              local_68[POPCOUNT(uVar24 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar18] >> 10) &
                                          0x3f)) + -1] =
                   local_68[POPCOUNT(uVar24 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar18] >>
                                                      10) & 0x3f)) + -1] + '\x01';
              uVar18 = uVar18 + 1;
            } while (local_70 != uVar18);
          }
          pdVar17 = (double *)(ulong)(uVar14 + (uVar14 == 0));
          pdVar23 = (double *)0x0;
          do {
            switch((byte)local_68[(long)pdVar23] + 9 >> 4) {
            case 0:
              puVar8 = (undefined8 *)operator_new(0xa8);
              *puVar8 = 0;
              *(undefined4 *)(puVar8 + 1) = 0;
              lVar15 = 0x4c;
              do {
                *(undefined8 *)((long)puVar8 + lVar15 + -4) = 0;
                lVar15 = lVar15 + 0x10;
              } while (lVar15 != 0xac);
              uVar18 = 2;
              break;
            case 1:
              puVar8 = (undefined8 *)operator_new(0x228);
              *puVar8 = 0;
              *(undefined4 *)(puVar8 + 1) = 0;
              lVar15 = 0xcc;
              do {
                *(undefined8 *)((long)puVar8 + lVar15 + -4) = 0;
                lVar15 = lVar15 + 0x10;
              } while (lVar15 != 0x22c);
              uVar18 = 3;
              break;
            case 2:
              puVar8 = (undefined8 *)operator_new(0x3a8);
              *puVar8 = 0;
              *(undefined4 *)(puVar8 + 1) = 0;
              lVar15 = 0x14c;
              do {
                *(undefined8 *)((long)puVar8 + lVar15 + -4) = 0;
                lVar15 = lVar15 + 0x10;
              } while (lVar15 != 0x3ac);
              uVar18 = 4;
              break;
            case 3:
              puVar8 = (undefined8 *)operator_new(0x528);
              *puVar8 = 0;
              *(undefined4 *)(puVar8 + 1) = 0;
              lVar15 = 0x1cc;
              do {
                *(undefined8 *)((long)puVar8 + lVar15 + -4) = 0;
                lVar15 = lVar15 + 0x10;
              } while (lVar15 != 0x52c);
              uVar18 = 5;
              break;
            default:
              goto switchD_00326bf6_default;
            }
            puVar8[2] = 0;
            puVar7[(long)pdVar23 + 1] = uVar18 | (ulong)puVar8;
switchD_00326bf6_default:
            pdVar23 = (double *)((long)pdVar23 + 1);
          } while (pdVar23 != pdVar17);
          if (0 < (int)local_70) {
            pEVar16 = (this_00->entries)._M_elems;
            pdVar17 = (double *)0x0;
            do {
              uVar18 = puVar7[POPCOUNT(uVar24 >> ((byte)((uint)(this_00->hashes)._M_elems
                                                               [(long)pdVar17] >> 10) & 0x3f))];
              switch((uint)uVar18 & 7) {
              case 2:
                uVar19 = (ulong)pEVar16->key_ & 0xffffffff;
                uVar20 = (ulong)pEVar16->key_ >> 0x20;
                InnerLeaf<1>::insert_entry
                          ((InnerLeaf<1> *)(uVar18 & 0xfffffffffffffff8),
                           (uVar20 + 0x80c8963be3e4c2f3) * (uVar19 + 0xc8497d2a400d9551) >> 0x20 ^
                           (uVar20 + 0x8a183895eeac1536) * (uVar19 + 0x42d8680e260ae5b),iVar21,
                           pEVar16);
                break;
              case 3:
                uVar19 = (ulong)pEVar16->key_ & 0xffffffff;
                uVar20 = (ulong)pEVar16->key_ >> 0x20;
                InnerLeaf<2>::insert_entry
                          ((InnerLeaf<2> *)(uVar18 & 0xfffffffffffffff8),
                           (uVar20 + 0x80c8963be3e4c2f3) * (uVar19 + 0xc8497d2a400d9551) >> 0x20 ^
                           (uVar20 + 0x8a183895eeac1536) * (uVar19 + 0x42d8680e260ae5b),iVar21,
                           pEVar16);
                break;
              case 4:
                uVar19 = (ulong)pEVar16->key_ & 0xffffffff;
                uVar20 = (ulong)pEVar16->key_ >> 0x20;
                InnerLeaf<3>::insert_entry
                          ((InnerLeaf<3> *)(uVar18 & 0xfffffffffffffff8),
                           (uVar20 + 0x80c8963be3e4c2f3) * (uVar19 + 0xc8497d2a400d9551) >> 0x20 ^
                           (uVar20 + 0x8a183895eeac1536) * (uVar19 + 0x42d8680e260ae5b),iVar21,
                           pEVar16);
                break;
              case 5:
                uVar19 = (ulong)pEVar16->key_ & 0xffffffff;
                uVar20 = (ulong)pEVar16->key_ >> 0x20;
                InnerLeaf<4>::insert_entry
                          ((InnerLeaf<4> *)(uVar18 & 0xfffffffffffffff8),
                           (uVar20 + 0x80c8963be3e4c2f3) * (uVar19 + 0xc8497d2a400d9551) >> 0x20 ^
                           (uVar20 + 0x8a183895eeac1536) * (uVar19 + 0x42d8680e260ae5b),iVar21,
                           pEVar16);
              }
              pdVar17 = (double *)((long)pdVar17 + 1);
              pEVar16 = pEVar16 + 1;
            } while ((long)pdVar17 < (long)this_00->size);
          }
          operator_delete(this_00);
          pVar28._8_8_ = extraout_RDX_03;
          pVar28.first = pdVar17;
          insertNode = (NodePtr *)(puVar7 + POPCOUNT(uVar24 >> sVar9));
        }
        if (iVar5 < 7) {
          return pVar28;
        }
      }
      goto LAB_003267af;
    }
    memset(puVar7 + 1,0,(ulong)(uVar14 << 3));
    iVar21 = this_00->size;
    if (0 < (long)iVar21) {
      paVar22 = &this_00->entries;
      uVar18 = 0;
      do {
        lVar15 = POPCOUNT(uVar24 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar18] >> 10) & 0x3f))
        ;
        if ((puVar7[lVar15] & 7) == 0) {
          puVar8 = (undefined8 *)operator_new(0x20);
          *puVar8 = 0;
          dVar3 = paVar22->_M_elems[0].value_;
          *(pair<int,_int> *)(puVar8 + 1) = paVar22->_M_elems[0].key_;
          puVar8[2] = dVar3;
          *(undefined4 *)(puVar8 + 3) = 1;
          puVar7[lVar15] = (ulong)puVar8 | 1;
        }
        else {
          puVar12 = (undefined8 *)(puVar7[lVar15] & 0xfffffffffffffff8);
          puVar8 = (undefined8 *)operator_new(0x18);
          puVar8[2] = puVar12[2];
          uVar11 = puVar12[1];
          *puVar8 = *puVar12;
          puVar8[1] = uVar11;
          *puVar12 = puVar8;
          *(int *)(puVar12 + 1) = paVar22->_M_elems[0].key_.first;
          *(int *)((long)puVar12 + 0xc) = paVar22->_M_elems[0].key_.second;
          puVar12[2] = paVar22->_M_elems[0].value_;
          *(int *)(puVar12 + 3) = *(int *)(puVar12 + 3) + 1;
        }
        uVar18 = uVar18 + 1;
        paVar22 = (array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                  (paVar22->_M_elems + 1);
      } while (uVar18 < (ulong)(long)iVar21);
    }
    operator_delete(this_00);
    if ((puVar7[POPCOUNT(uVar24 >> sVar9)] & 7) == 0) {
      puVar8 = (undefined8 *)operator_new(0x20);
      *puVar8 = 0;
      dVar3 = entry->value_;
      *(pair<int,_int> *)(puVar8 + 1) = entry->key_;
      puVar8[2] = dVar3;
      *(undefined4 *)(puVar8 + 3) = 1;
      puVar7[POPCOUNT(uVar24 >> sVar9)] = (ulong)puVar8 | 1;
      uVar11 = extraout_RDX_02;
    }
    else {
      puVar8 = (undefined8 *)(puVar7[POPCOUNT(uVar24 >> sVar9)] & 0xfffffffffffffff8);
      puVar12 = (undefined8 *)operator_new(0x18);
      puVar12[2] = puVar8[2];
      uVar11 = puVar8[1];
      *puVar12 = *puVar8;
      puVar12[1] = uVar11;
      *puVar8 = puVar12;
      *(int *)(puVar8 + 1) = (entry->key_).first;
      *(int *)((long)puVar8 + 0xc) = (entry->key_).second;
      puVar8[2] = entry->value_;
      *(int *)(puVar8 + 3) = *(int *)(puVar8 + 3) + 1;
      uVar11 = extraout_RDX_01;
    }
LAB_003265bd:
    pVar27._9_7_ = (int7)((ulong)uVar11 >> 8);
    pVar27.second = true;
    pVar27.first = (double *)(puVar8 + 2);
    break;
  case 6:
    uVar18 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    branch = (BranchNode *)(uVar24 & 0xfffffffffffffff8);
    uVar24 = (branch->occupation).occupation;
    bVar2 = (byte)uVar18;
    lVar15 = POPCOUNT(uVar24 >> (bVar2 & 0x3f));
    if ((uVar24 >> (uVar18 & 0x3f) & 1) == 0) {
      branch = addChildToBranchNode(branch,bVar2 & 0x3f,(int)lVar15);
      branch->child[lVar15].ptrAndType = 0;
      (branch->occupation).occupation = (branch->occupation).occupation | 1L << (bVar2 & 0x3f);
    }
    else {
      lVar15 = lVar15 + -1;
    }
    insertNode->ptrAndType = (ulong)branch | 6;
    iVar21 = hashPos + 1;
    insertNode = branch->child + lVar15;
    goto LAB_003267af;
  case 7:
    iVar21 = hashPos;
LAB_003267af:
    pVar27 = insert_recurse(insertNode,hash,iVar21,entry);
  }
  return pVar27;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }